

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O3

void Am_Text_Create_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  char *pcVar3;
  Am_String edited_text;
  Am_Object command;
  Am_String local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  pAVar2 = Am_Object::Get(inter,0xe7,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (!bVar1) {
    pAVar2 = Am_Object::Get(inter,0x16d,0);
    Am_Object::Am_Object(&local_28,pAVar2);
    pAVar2 = Am_Object::Get(&local_28,0xab,0);
    Am_String::Am_String(&local_30,pAVar2);
    pcVar3 = Am_String::operator_cast_to_char_(&local_30);
    if (*pcVar3 == '\0') {
      Am_Object::Am_Object(&local_20,inter);
      Am_Abort_Interactor(&local_20,true);
      Am_Object::~Am_Object(&local_20);
      Am_String::~Am_String(&local_30);
      goto LAB_001c00d4;
    }
    Am_String::~Am_String(&local_30);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Object::Am_Object(&local_18,inter);
  Am_Text_Do_proc(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)inter,0xc5);
LAB_001c00d4:
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Text_Create_Do, (Am_Object inter))
{
  bool create_if_zero = inter.Get(Am_CREATE_IF_ZERO_LENGTH);
  if (!create_if_zero) {
    Am_Object text = inter.Get(Am_OBJECT_MODIFIED);
    Am_String edited_text = text.Get(Am_TEXT);
    const char *str = edited_text;
    if (strlen(str) == 0) {
      Am_Abort_Interactor(inter);
      return;
    }
  }
  Am_Text_Do_proc(inter);
  Am_Object command = inter.Get_Object(Am_COMMAND);
}